

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O2

string * __thiscall
vkt::pipeline::(anonymous_namespace)::CacheTestParam::generateTestName_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  undefined1 in_CL;
  ulong uVar1;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  getShaderFlagStr_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)(ulong)*(uint *)((long)this + 8),0,
             (bool)in_CL);
  for (uVar1 = 1; uVar1 < *(ulong *)((long)this + 0x20); uVar1 = (ulong)((int)uVar1 + 1)) {
    getShaderFlagStr_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)(ulong)*(uint *)((long)this + uVar1 * 4 + 8),0,
               (bool)in_CL);
    std::operator+(&local_50,'_',&local_70);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string CacheTestParam::generateTestName (void) const
{
	std::string result(getShaderFlagStr(m_shaders[0], false));

	for(deUint32 ndx = 1; ndx < m_shaderCount; ndx++)
		result += '_' + getShaderFlagStr(m_shaders[ndx], false) ;

	return result;
}